

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeLeaveCoPrhs4Row
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int i,int n)

{
  long lVar1;
  uint uVar2;
  
  uVar2 = (this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thedesc.rowstat.data[n] + D_ON_BOTH;
  lVar1 = 0x98;
  if (uVar2 < 0xd) {
    lVar1 = *(long *)(&DAT_00489c30 + (ulong)uVar2 * 8);
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (&(this->theCoPrhs->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend,
             (cpp_dec_float<200U,_int,_void> *)
             ((long)n * 0x80 +
             *(long *)((long)&(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._vptr_ClassArray + lVar1)));
  return;
}

Assistant:

void SPxSolverBase<R>::computeLeaveCoPrhs4Row(int i, int n)
{
   assert(this->baseId(i).isSPxRowId());
   assert(this->number(SPxRowId(this->baseId(i))) == n);

   switch(this->desc().rowStatus(n))
   {
   case SPxBasisBase<R>::Desc::D_ON_BOTH :
   case SPxBasisBase<R>::Desc::P_FIXED :
      assert(theLRbound[n] > R(-infinity));
      assert(EQ(theURbound[n], theLRbound[n], this->epsilon()));

   //lint -fallthrough
   case SPxBasisBase<R>::Desc::D_ON_UPPER :
   case SPxBasisBase<R>::Desc::P_ON_UPPER :
      assert(theURbound[n] < R(infinity));
      (*theCoPrhs)[i] = theURbound[n];
      break;

   case SPxBasisBase<R>::Desc::D_ON_LOWER :
   case SPxBasisBase<R>::Desc::P_ON_LOWER :
      assert(theLRbound[n] > R(-infinity));
      (*theCoPrhs)[i] = theLRbound[n];
      break;

   default:
      (*theCoPrhs)[i] = this->maxRowObj(n);
      break;
   }
}